

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O1

void movd_EP(PDISASM pMyDisasm)

{
  char *pcVar1;
  UInt8 UVar2;
  Int32 IVar3;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    if ((pMyDisasm->Reserved_).VEX.pp != '\x01') {
LAB_001224e9:
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
      (pMyDisasm->Operand1).AccessMode = 0;
      (pMyDisasm->Operand2).AccessMode = 0;
      (pMyDisasm->Operand3).AccessMode = 0;
      (pMyDisasm->Operand4).AccessMode = 0;
      (pMyDisasm->Operand5).AccessMode = 0;
      (pMyDisasm->Operand6).AccessMode = 0;
      (pMyDisasm->Operand7).AccessMode = 0;
      (pMyDisasm->Operand8).AccessMode = 0;
      (pMyDisasm->Operand9).AccessMode = 0;
      (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
      return;
    }
    UVar2 = (pMyDisasm->Reserved_).EVEX.state;
    if (UVar2 == '\x01') {
      (pMyDisasm->Instruction).Category = 0x140001;
      (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
LAB_001224bf:
      if ((pMyDisasm->Reserved_).EVEX.W != '\0') goto LAB_001224c8;
LAB_00122534:
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vmovd",6);
      IVar3 = 3;
    }
    else {
      (pMyDisasm->Instruction).Category = 0x110001;
      if ((pMyDisasm->Reserved_).REX.W_ == '\0') goto LAB_00122534;
      if (UVar2 == '\x01') goto LAB_001224bf;
LAB_001224c8:
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vmovq",6);
      IVar3 = 4;
    }
    (pMyDisasm->Reserved_).MemDecoration = IVar3;
  }
  else {
    (pMyDisasm->Instruction).Category = 0x30001;
    if ((pMyDisasm->Reserved_).PrefRepe == 1) {
      (pMyDisasm->Prefix).RepPrefix = '\b';
      (pMyDisasm->Reserved_).MemDecoration = 0x68;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"movq",5);
    }
    else {
      if ((pMyDisasm->Prefix).OperandSize != '\x01') {
        if ((pMyDisasm->Reserved_).PrefRepne == 1) goto LAB_001224e9;
        pcVar1 = (pMyDisasm->Instruction).Mnemonic;
        if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
          (pMyDisasm->Reserved_).MemDecoration = 4;
          builtin_strncpy(pcVar1,"movq",5);
        }
        else {
          (pMyDisasm->Reserved_).MemDecoration = 3;
          builtin_strncpy(pcVar1,"movd",5);
        }
        decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
        (pMyDisasm->Reserved_).Register_ = 2;
        goto LAB_00122565;
      }
      (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
      (pMyDisasm->Prefix).OperandSize = '\b';
      pcVar1 = (pMyDisasm->Instruction).Mnemonic;
      if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
        (pMyDisasm->Reserved_).MemDecoration = 4;
        builtin_strncpy(pcVar1,"movq",5);
      }
      else {
        (pMyDisasm->Reserved_).MemDecoration = 3;
        builtin_strncpy(pcVar1,"movd",5);
      }
    }
  }
  decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
  (pMyDisasm->Reserved_).Register_ = 4;
LAB_00122565:
  decodeRegOpcode(&pMyDisasm->Operand2,pMyDisasm);
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  return;
}

Assistant:

void __bea_callspec__ movd_EP(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if (GV.EVEX.state == InUsePrefix) {
        pMyDisasm->Instruction.Category = AVX512_INSTRUCTION+DATA_TRANSFER;
        GV.EVEX.tupletype = TUPLE1_SCALAR;
      }
      else {
        pMyDisasm->Instruction.Category = AVX_INSTRUCTION+DATA_TRANSFER;
      }
      if (
        ((GV.EVEX.state != InUsePrefix) && (GV.REX.W_ == 0)) ||
        ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.W == 0))
        ) {
        #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmovd");
        #endif
        GV.MemDecoration = Arg1dword;
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmovq");
        #endif
        GV.MemDecoration = Arg1qword;
      }
      decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
      GV.Register_ = SSE_REG;
      decodeRegOpcode(&pMyDisasm->Operand2, pMyDisasm);
      GV.EIP_ += GV.DECALAGE_EIP+2;
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {

    pMyDisasm->Instruction.Category = MMX_INSTRUCTION+DATA_TRANSFER;
    /* ========= 0xf3 */
    if (GV.PrefRepe == 1) {
      pMyDisasm->Prefix.RepPrefix = MandatoryPrefix;
      GV.MemDecoration = Arg2qword;
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movq");
      #endif
      decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
      GV.Register_ = SSE_REG;
      decodeRegOpcode(&pMyDisasm->Operand2, pMyDisasm);
      GV.EIP_ += GV.DECALAGE_EIP+2;
    }
    /* ========== 0x66 */
    else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
      GV.OperandSize = GV.OriginalOperandSize;
      pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
      if (GV.REX.W_ == 1) {
        GV.MemDecoration = Arg1qword;
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movq");
        #endif
      }
      else {
        GV.MemDecoration = Arg1dword;
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movd");
        #endif
      }
      decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
      GV.Register_ = SSE_REG;
      decodeRegOpcode(&pMyDisasm->Operand2, pMyDisasm);
      GV.EIP_ += GV.DECALAGE_EIP+2;
    }
    else {
      if (prefixes_present(pMyDisasm)) { failDecode(pMyDisasm); return; }
      if (GV.REX.W_ == 1) {
        GV.MemDecoration = Arg1qword;
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movq");
        #endif
      }
      else {
        GV.MemDecoration = Arg1dword;
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movd");
        #endif
      }
      decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
      GV.Register_ = MMX_REG;
      decodeRegOpcode(&pMyDisasm->Operand2, pMyDisasm);
      GV.EIP_ += GV.DECALAGE_EIP+2;
    }
  }
}